

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_abc_k(jit_State *J)

{
  ushort uVar1;
  int iVar2;
  IRIns *pIVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  
  if ((J->flags & 0x800000) == 0) {
    return 0;
  }
  uVar6 = (uint)J->chain[10];
  uVar1 = (J->fold).ins.field_0.op1;
  do {
    if (uVar6 <= uVar1) {
      uVar6 = (J->cur).nins;
      uVar7 = (ulong)uVar6;
      if (J->irtoplim <= uVar6) {
        lj_ir_growtop(J);
      }
      (J->cur).nins = uVar6 + 1;
      pIVar3 = (J->cur).ir;
      bVar5 = (J->fold).ins.field_1.o;
      *(IRRef1 *)((long)pIVar3 + uVar7 * 8 + 6) = J->chain[bVar5];
      J->chain[bVar5] = (IRRef1)uVar6;
      *(byte *)((long)pIVar3 + uVar7 * 8 + 5) = bVar5;
      pIVar3[uVar7].field_0.op1 = (J->fold).ins.field_0.op1;
      *(IRRef1 *)((long)pIVar3 + uVar7 * 8 + 2) = (J->fold).ins.field_0.op2;
      iVar2 = *(int *)((long)&(J->fold).ins + 4);
      bVar5 = (byte)iVar2;
      (J->guardemit).irt = (J->guardemit).irt | bVar5;
      *(byte *)((long)pIVar3 + uVar7 * 8 + 4) = bVar5;
      return iVar2 * 0x1000000 + uVar6;
    }
    pIVar3 = (J->cur).ir;
    uVar7 = (ulong)uVar6;
    if ((pIVar3[uVar7].field_0.op1 == uVar1) &&
       (lVar8 = (long)*(short *)((long)pIVar3 + uVar7 * 8 + 2), -1 < lVar8)) {
      if (pIVar3[lVar8].i < (J->fold).right[0].i) {
        *(IRRef1 *)((long)pIVar3 + uVar7 * 8 + 2) = (J->fold).ins.field_0.op2;
      }
      bVar4 = false;
    }
    else {
      uVar6 = (uint)*(ushort *)((long)pIVar3 + uVar7 * 8 + 6);
      bVar4 = true;
    }
  } while (bVar4);
  return 4;
}

Assistant:

LJFOLD(ABC any KINT)
LJFOLDF(abc_k)
{
  if (LJ_LIKELY(J->flags & JIT_F_OPT_ABC)) {
    IRRef ref = J->chain[IR_ABC];
    IRRef asize = fins->op1;
    while (ref > asize) {
      IRIns *ir = IR(ref);
      if (ir->op1 == asize && irref_isk(ir->op2)) {
	int32_t k = IR(ir->op2)->i;
	if (fright->i > k)
	  ir->op2 = fins->op2;
	return DROPFOLD;
      }
      ref = ir->prev;
    }
    return EMITFOLD;  /* Already performed CSE. */
  }
  return NEXTFOLD;
}